

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu511.c
# Opt level: O0

MPP_RET hal_jpege_vepu511_wait(void *hal,HalEncTask *task)

{
  long lVar1;
  MPP_RET MVar2;
  JpegV511Status *elem;
  HalEncTask *enc_task;
  JpegeV511HalContext *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x78);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v511","(%d) enter\n","hal_jpege_vepu511_wait",0x25c);
  }
  if ((task->flags).err == 0) {
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
    if (MVar2 == MPP_OK) {
      hal_jpege_vepu511_status_check(hal);
      task->hw_length = *(int *)(lVar1 + 0x68) + task->hw_length;
      ctx._4_4_ = MPP_OK;
    }
    else {
      _mpp_log_l(2,"hal_jpege_v511","poll cmd failed %d\n","hal_jpege_vepu511_wait",
                 (ulong)(uint)MVar2);
      ctx._4_4_ = MPP_ERR_VPUHW;
    }
    if ((hal_jpege_debug & 1) != 0) {
      _mpp_log_l(4,"hal_jpege_v511","(%d) leave\n","hal_jpege_vepu511_wait",0x26d);
    }
    hal_local._4_4_ = ctx._4_4_;
  }
  else {
    _mpp_log_l(2,"hal_jpege_v511","enc_task->flags.err %08x, return early","hal_jpege_vepu511_wait",
               (ulong)(task->flags).err);
    hal_local._4_4_ = MPP_NOK;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_jpege_vepu511_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    JpegeV511HalContext *ctx = (JpegeV511HalContext *)hal;
    HalEncTask *enc_task = task;
    JpegV511Status *elem = (JpegV511Status *)ctx->reg_out;
    hal_jpege_enter();

    if (enc_task->flags.err) {
        mpp_err_f("enc_task->flags.err %08x, return early",
                  enc_task->flags.err);
        return MPP_NOK;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret) {
        mpp_err_f("poll cmd failed %d\n", ret);
        ret = MPP_ERR_VPUHW;
    } else {
        hal_jpege_vepu511_status_check(hal);
        task->hw_length += elem->st.jpeg_head_bits_l32;
    }

    hal_jpege_leave();
    return ret;
}